

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  sqlite3 *psVar2;
  uchar *zPattern;
  uchar *zString;
  uchar *local_58;
  uchar *zEsc;
  compareInfo *pcStack_48;
  compareInfo backupInfo;
  compareInfo *pInfo;
  sqlite3 *db;
  int nPat;
  u32 escape;
  uchar *zB;
  uchar *zA;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  psVar2 = sqlite3_context_db_handle(context);
  pcStack_48 = (compareInfo *)sqlite3_user_data(context);
  iVar1 = sqlite3_value_bytes(*argv);
  if (psVar2->aLimit[8] < iVar1) {
    sqlite3_result_error(context,"LIKE or GLOB pattern too complex",-1);
    return;
  }
  if (argc == 3) {
    local_58 = sqlite3_value_text(argv[2]);
    if (local_58 == (uchar *)0x0) {
      return;
    }
    iVar1 = sqlite3Utf8CharLen((char *)local_58,-1);
    if (iVar1 != 1) {
      sqlite3_result_error(context,"ESCAPE expression must be a single character",-1);
      return;
    }
    db._4_4_ = sqlite3Utf8Read(&local_58);
    if ((db._4_4_ == pcStack_48->matchAll) || (db._4_4_ == pcStack_48->matchOne)) {
      zEsc._4_4_ = *pcStack_48;
      pcStack_48 = (compareInfo *)((long)&zEsc + 4);
      if (db._4_4_ == ((uint)zEsc._4_4_ & 0xff)) {
        zEsc._4_1_ = 0;
      }
    }
  }
  else {
    db._4_4_ = (uint)pcStack_48->matchSet;
  }
  zPattern = sqlite3_value_text(*argv);
  zString = sqlite3_value_text(argv[1]);
  if ((zString != (uchar *)0x0) && (zPattern != (uchar *)0x0)) {
    iVar1 = patternCompare(zPattern,zString,pcStack_48,db._4_4_);
    sqlite3_result_int(context,(uint)(iVar1 == 0));
  }
  return;
}

Assistant:

static void likeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);
  struct compareInfo *pInfo = sqlite3_user_data(context);
  struct compareInfo backupInfo;

#ifdef SQLITE_LIKE_DOESNT_MATCH_BLOBS
  if( sqlite3_value_type(argv[0])==SQLITE_BLOB
   || sqlite3_value_type(argv[1])==SQLITE_BLOB
  ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, 0);
    return;
  }
#endif

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context,
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
    if( escape==pInfo->matchAll || escape==pInfo->matchOne ){
      memcpy(&backupInfo, pInfo, sizeof(backupInfo));
      pInfo = &backupInfo;
      if( escape==pInfo->matchAll ) pInfo->matchAll = 0;
      if( escape==pInfo->matchOne ) pInfo->matchOne = 0;
    }
  }else{
    escape = pInfo->matchSet;
  }
  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);
  if( zA && zB ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context,
                      patternCompare(zB, zA, pInfo, escape)==SQLITE_MATCH);
  }
}